

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcheckbox.cpp
# Opt level: O3

void QCheckBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      local_1c = *_a[1];
      iVar3 = 1;
    }
    else {
      if (_id != 0) break;
      local_1c = *_a[1];
      iVar3 = 0;
    }
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
    break;
  case ReadProperty:
    if (_id == 0) {
      *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0x2b4) & 1;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      *(byte *)(*(long *)(_o + 8) + 0x2b4) = *(byte *)(*(long *)(_o + 8) + 0x2b4) & 0xfe | **_a;
    }
    break;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == stateChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == checkStateChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCheckBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCheckBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->checkStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::CheckState>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(int )>(_a, &QCheckBox::stateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(Qt::CheckState )>(_a, &QCheckBox::checkStateChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTristate(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTristate(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}